

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_writer.cc
# Opt level: O2

void __thiscall
NanomsgWriter::NanomsgWriter
          (NanomsgWriter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *endpoints)

{
  pointer pbVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  runtime_error *prVar6;
  pointer pbVar7;
  string asStack_1d8 [36];
  int size;
  stringstream ss;
  ostream local_1a0 [376];
  
  PacketWriter::PacketWriter(&this->super_PacketWriter);
  (this->super_PacketWriter)._vptr_PacketWriter = (_func_int **)&PTR__NanomsgWriter_0013f5e8;
  iVar2 = nn_socket(1,0x20);
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar4 = std::operator<<(local_1a0,"nn_socket: ");
    iVar2 = nn_errno();
    pcVar5 = nn_strerror(iVar2);
    std::operator<<(poVar4,pcVar5);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_1d8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar7 = (endpoints->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (endpoints->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pbVar7 == pbVar1) {
      size = 0x100000;
      iVar3 = nn_setsockopt(this->fd_,0,2,&size,4);
      if (-1 < iVar3) {
        this->fd_ = iVar2;
        return;
      }
      nn_close(this->fd_);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar4 = std::operator<<(local_1a0,"nn_setsockopt: ");
      iVar2 = nn_errno();
      pcVar5 = nn_strerror(iVar2);
      std::operator<<(poVar4,pcVar5);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,asStack_1d8);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = nn_bind(iVar2,(pbVar7->_M_dataplus)._M_p);
    if (iVar3 < 0) break;
    pbVar7 = pbVar7 + 1;
  }
  nn_close(iVar2);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar4 = std::operator<<(local_1a0,"nn_bind: ");
  iVar2 = nn_errno();
  pcVar5 = nn_strerror(iVar2);
  std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(local_1a0," (");
  poVar4 = std::operator<<(poVar4,(string *)pbVar7);
  std::operator<<(poVar4,")");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,asStack_1d8);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

NanomsgWriter::NanomsgWriter(const std::vector<std::string>& endpoints) {
  auto fd = nn_socket(AF_SP, NN_PUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  for (const auto& endpoint : endpoints) {
    auto rv = nn_bind(fd, endpoint.c_str());
    if (rv < 0) {
      nn_close(fd);
      std::stringstream ss;
      ss << "nn_bind: " << nn_strerror(nn_errno());
      ss << " (" << endpoint << ")";
      throw std::runtime_error(ss.str());
    }
  }

  int size = 1048576;
  auto rv = nn_setsockopt(fd_, NN_SOL_SOCKET, NN_SNDBUF, &size, sizeof(size));
  if (rv < 0) {
    nn_close(fd_);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  fd_ = fd;
}